

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeCompareMemString(Mem *pMem1,Mem *pMem2,CollSeq *pColl,u8 *prcErr)

{
  void *pvVar1;
  void *pvVar2;
  int local_c8;
  int local_c4;
  undefined1 local_c0 [8];
  Mem c2;
  Mem c1;
  int n2;
  int n1;
  void *v2;
  void *v1;
  int rc;
  u8 *prcErr_local;
  CollSeq *pColl_local;
  Mem *pMem2_local;
  Mem *pMem1_local;
  
  if (pMem1->enc == pColl->enc) {
    pMem1_local._4_4_ = (*pColl->xCmp)(pColl->pUser,pMem1->n,pMem1->z,pMem2->n,pMem2->z);
  }
  else {
    sqlite3VdbeMemInit((Mem *)&c2.xDel,pMem1->db,1);
    sqlite3VdbeMemInit((Mem *)local_c0,pMem1->db,1);
    sqlite3VdbeMemShallowCopy((Mem *)&c2.xDel,pMem1,0x1000);
    sqlite3VdbeMemShallowCopy((Mem *)local_c0,pMem2,0x1000);
    pvVar1 = sqlite3ValueText((sqlite3_value *)&c2.xDel,pColl->enc);
    if (pvVar1 == (void *)0x0) {
      local_c4 = 0;
    }
    else {
      local_c4 = c1.u.i._4_4_;
    }
    pvVar2 = sqlite3ValueText((sqlite3_value *)local_c0,pColl->enc);
    if (pvVar2 == (void *)0x0) {
      local_c8 = 0;
    }
    else {
      local_c8 = c2.u.i._4_4_;
    }
    pMem1_local._4_4_ = (*pColl->xCmp)(pColl->pUser,local_c4,pvVar1,local_c8,pvVar2);
    if (((pvVar1 == (void *)0x0) || (pvVar2 == (void *)0x0)) && (prcErr != (u8 *)0x0)) {
      *prcErr = '\a';
    }
    sqlite3VdbeMemRelease((Mem *)&c2.xDel);
    sqlite3VdbeMemRelease((Mem *)local_c0);
  }
  return pMem1_local._4_4_;
}

Assistant:

static int vdbeCompareMemString(
  const Mem *pMem1,
  const Mem *pMem2,
  const CollSeq *pColl,
  u8 *prcErr                      /* If an OOM occurs, set to SQLITE_NOMEM */
){
  if( pMem1->enc==pColl->enc ){
    /* The strings are already in the correct encoding.  Call the
     ** comparison function directly */
    return pColl->xCmp(pColl->pUser,pMem1->n,pMem1->z,pMem2->n,pMem2->z);
  }else{
    int rc;
    const void *v1, *v2;
    int n1, n2;
    Mem c1;
    Mem c2;
    sqlite3VdbeMemInit(&c1, pMem1->db, MEM_Null);
    sqlite3VdbeMemInit(&c2, pMem1->db, MEM_Null);
    sqlite3VdbeMemShallowCopy(&c1, pMem1, MEM_Ephem);
    sqlite3VdbeMemShallowCopy(&c2, pMem2, MEM_Ephem);
    v1 = sqlite3ValueText((sqlite3_value*)&c1, pColl->enc);
    n1 = v1==0 ? 0 : c1.n;
    v2 = sqlite3ValueText((sqlite3_value*)&c2, pColl->enc);
    n2 = v2==0 ? 0 : c2.n;
    rc = pColl->xCmp(pColl->pUser, n1, v1, n2, v2);
    if( (v1==0 || v2==0) && prcErr ) *prcErr = SQLITE_NOMEM_BKPT;
    sqlite3VdbeMemRelease(&c1);
    sqlite3VdbeMemRelease(&c2);
    return rc;
  }
}